

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * getTypedProperty<std::__cxx11::string>
                   (string *__return_storage_ptr__,cmGeneratorTarget *tgt,string *prop,
                   cmGeneratorExpressionInterpreter *genexInterpreter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmValue value;
  string *psVar3;
  string local_48;
  
  value = cmGeneratorTarget::GetProperty(tgt,prop);
  if (genexInterpreter == (cmGeneratorExpressionInterpreter *)0x0) {
    valueAsString<cmValue>(__return_storage_ptr__,value);
  }
  else {
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    if (value.Value == (string *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    }
    else {
      pcVar2 = ((value.Value)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + (value.Value)->_M_string_length);
    }
    psVar3 = cmGeneratorExpressionInterpreter::Evaluate(genexInterpreter,&local_48,prop);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar3->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getTypedProperty<std::string>(
  cmGeneratorTarget const* tgt, const std::string& prop,
  cmGeneratorExpressionInterpreter* genexInterpreter)
{
  cmValue value = tgt->GetProperty(prop);

  if (genexInterpreter == nullptr) {
    return valueAsString(value);
  }

  return genexInterpreter->Evaluate(value ? *value : "", prop);
}